

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O3

void DumpData(PtexTexture *r,int faceid,bool dumpall)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *__ptr;
  ostream *poVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  PtexReader *R;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  
  uVar10 = 1;
  if (r != (PtexTexture *)0x0 && dumpall) {
    uVar10 = (uint)*(ushort *)((long)&r[0x13]._vptr_PtexTexture + 6);
  }
  iVar2 = (*r->_vptr_PtexTexture[0x10])(r,(ulong)(uint)faceid);
  uVar3 = (*r->_vptr_PtexTexture[0xb])(r);
  __ptr = malloc((long)(int)uVar3 << 2);
  if (uVar10 != 0) {
    uVar7 = *(ushort *)CONCAT44(extraout_var,iVar2);
    if (('\0' < (char)uVar7) && (uVar1 = uVar7 >> 8, '\0' < (char)(uVar7 >> 8))) {
      do {
        bVar5 = (byte)uVar7;
        uVar9 = 1 << (bVar5 & 0x1f);
        bVar6 = (byte)uVar1;
        uVar12 = 1 << (bVar6 & 0x1f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  data (",8);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," x ",3);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
        if ((*(byte *)((long)CONCAT44(extraout_var,iVar2) + 3) & 1) != 0) {
          uVar9 = 1;
          uVar12 = 1;
        }
        if (uVar12 != 1 || uVar9 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          if (0 < (int)uVar12) goto LAB_0010ac94;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", const: ",9);
LAB_0010ac94:
          uVar8 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar13 = 0;
              do {
                if (uVar12 != 1 || uVar9 != 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\n    (",6);
                  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar13);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"): ",3);
                }
                (*r->_vptr_PtexTexture[0x16])
                          (r,(ulong)(uint)faceid,(ulong)uVar13,(ulong)uVar8,__ptr,0,
                           CONCAT44(extraout_var_00,uVar3),(ulong)CONCAT11(bVar6,bVar5));
                if (0 < (int)uVar3) {
                  uVar11 = 0;
                  do {
                    printf(" %.3f",(double)*(float *)((long)__ptr + uVar11 * 4));
                    uVar11 = uVar11 + 1;
                  } while (uVar3 != uVar11);
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar9);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar12);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        std::ostream::flush();
        uVar10 = uVar10 - 1;
        if ((uVar10 == 0) || ((char)bVar5 < '\x02')) break;
        uVar7 = (ushort)(byte)(bVar5 - 1);
        uVar1 = uVar1 - 1;
      } while ('\x01' < (char)bVar6);
    }
  }
  free(__ptr);
  return;
}

Assistant:

void DumpData(PtexTexture* r, int faceid, bool dumpall)
{
    int levels = 1;
    if (dumpall) {
        PtexReader* R = static_cast<PtexReader*> (r);
        if (R) levels = R->header().nlevels;
    }

    const Ptex::FaceInfo& f = r->getFaceInfo(faceid);
    int nchan = r->numChannels();
    float* pixel = (float*) malloc(sizeof(float)*nchan);
    Ptex::Res res = f.res;
    while (levels && res.ulog2 >= 1 && res.vlog2 >= 1) {
        int ures = res.u(), vres = res.v();
        std::cout << "  data (" << ures << " x " << vres << ")";
        if (f.isConstant()) { ures = vres = 1; }
        bool isconst = (ures == 1 && vres == 1);
        if (isconst) std::cout << ", const: ";
        else std::cout << ":";
        for (int vi = 0; vi < vres; vi++) {
            for (int ui = 0; ui < ures; ui++) {
                if (!isconst) std::cout << "\n    (" << ui << ", " << vi << "): ";
                r->getPixel(faceid, ui, vi, pixel, 0, nchan, res);
                for (int c=0; c < nchan; c++) {
                    printf(" %.3f", pixel[c]);
                }
            }
        }
        std::cout << std::endl;
        res.ulog2--;
        res.vlog2--;
        levels--;
    }
    free(pixel);
}